

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

void gravity_fiber_blacken(gravity_vm *vm,gravity_fiber_t *fiber)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  gravity_value_t *pgVar4;
  gravity_object_t *obj;
  
  uVar1 = gravity_fiber_size(vm,fiber);
  gravity_vm_memupdate(vm,(ulong)uVar1);
  if (fiber->nframes != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      gravity_gray_object(vm,*(gravity_object_t **)((long)&fiber->frames->closure + lVar3));
      gravity_gray_object(vm,*(gravity_object_t **)((long)&fiber->frames->args + lVar3));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar2 < fiber->nframes);
  }
  for (pgVar4 = fiber->stack; pgVar4 < fiber->stacktop; pgVar4 = pgVar4 + 1) {
    gravity_gray_value(vm,*pgVar4);
  }
  for (obj = (gravity_object_t *)fiber->upvalues; obj != (gravity_object_t *)0x0;
      obj = (gravity_object_t *)obj->xdata) {
    gravity_gray_object(vm,obj);
  }
  gravity_gray_object(vm,(gravity_object_t *)fiber->caller);
  return;
}

Assistant:

void gravity_fiber_blacken (gravity_vm *vm, gravity_fiber_t *fiber) {
    gravity_vm_memupdate(vm, gravity_fiber_size(vm, fiber));
    
    // gray call frame functions
    for (uint32_t i=0; i < fiber->nframes; ++i) {
        gravity_gray_object(vm, (gravity_object_t *)fiber->frames[i].closure);
		gravity_gray_object(vm, (gravity_object_t *)fiber->frames[i].args);
    }

    // gray stack variables
    for (gravity_value_t *slot = fiber->stack; slot < fiber->stacktop; ++slot) {
        gravity_gray_value(vm, *slot);
    }

    // gray upvalues
    gravity_upvalue_t *upvalue = fiber->upvalues;
    while (upvalue) {
        gravity_gray_object(vm, (gravity_object_t *)upvalue);
        upvalue = upvalue->next;
    }

    gravity_gray_object(vm, (gravity_object_t *)fiber->caller);
}